

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O0

ThreadCache * __thiscall
tcmalloc::FixedAllocator<tcmalloc::ThreadCache>::AllocFromArea
          (FixedAllocator<tcmalloc::ThreadCache> *this)

{
  ThreadCache *pTVar1;
  char *pcVar2;
  void *result;
  void *ptr;
  FixedAllocator<tcmalloc::ThreadCache> *this_local;
  
  if (this->area_free_ < 0x1050) {
    pcVar2 = (char *)SystemAlloc(0x8000000);
    if (pcVar2 == (char *)0xffffffffffffffff) {
      return (ThreadCache *)0x0;
    }
    this->area_ = pcVar2;
    this->area_free_ = 0x8000000;
  }
  pTVar1 = (ThreadCache *)this->area_;
  this->area_ = this->area_ + 0x1050;
  this->area_free_ = this->area_free_ - 0x1050;
  return pTVar1;
}

Assistant:

T *AllocFromArea() {
        if (area_free_ < sizeof(T)) {
            void *ptr = SystemAlloc(areaSize_);
            if (ptr == (void *) (-1)) {
                return nullptr;
            }
            area_ = (char *) ptr;
            area_free_ = areaSize_;
        }
        void *result = area_;
        area_ += sizeof(T);
        area_free_ -= sizeof(T);
        return reinterpret_cast<T *>(result);
    }